

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseSet.h
# Opt level: O0

bool __thiscall SparseSet<0>::elem(SparseSet<0> *this,uint value)

{
  uint a;
  uint value_local;
  SparseSet<0> *this_local;
  bool local_1;
  
  if ((this->sparse[value] < this->members) && (this->dense[this->sparse[value]] == value)) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool elem(unsigned int value) const 
  {
    if( U&1 )
    {
      return (sparse[value] < members);
    } 
    else 
    {
      unsigned int a = sparse[value];
      if( a < members && dense[a] == value )
        return true;
      return false;
    }
  }